

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_rfc5444.c
# Opt level: O3

oonf_rfc5444_interface *
oonf_rfc5444_add_interface
          (oonf_rfc5444_protocol *protocol,oonf_rfc5444_interface_listener *listener,char *name)

{
  list_entity *plVar1;
  int iVar2;
  long lVar3;
  oonf_rfc5444_interface *poVar4;
  uint16_t rnd;
  
  lVar3 = avl_find(&protocol->_interface_tree,name);
  if (lVar3 == 0) {
    iVar2 = os_core_linux_get_random(&rnd,2);
    if (iVar2 == 0) {
      poVar4 = (oonf_rfc5444_interface *)oonf_class_malloc(&_interface_memcookie);
      if (poVar4 != (oonf_rfc5444_interface *)0x0) {
        strscpy(poVar4,name,0x10);
        poVar4->protocol = protocol;
        (poVar4->_node).key = poVar4;
        avl_insert(&protocol->_interface_tree,&poVar4->_node);
        avl_init(&poVar4->_target_tree,avl_comp_netaddr,0);
        (poVar4->_socket).config.receive_data = _cb_receive_data;
        (poVar4->_socket).config.dont_route = false;
        *(undefined7 *)&(poVar4->_socket).config.field_0x19 = 0;
        *(undefined4 *)&(poVar4->_socket).config.input_buffer = 0x10a2c0;
        *(undefined4 *)((long)&(poVar4->_socket).config.input_buffer + 4) = 0;
        *(undefined4 *)&(poVar4->_socket).config.input_buffer_length = 0x5c0;
        *(undefined4 *)((long)&(poVar4->_socket).config.input_buffer_length + 4) = 0;
        (poVar4->_socket).config.user = poVar4;
        (poVar4->_socket).cb_settings_change = _cb_interface_changed;
        (poVar4->_socket).config.dont_route = true;
        oonf_packet_add_managed(&poVar4->_socket);
        protocol->_msg_seqno = rnd;
        (poVar4->_listener).prev = &poVar4->_listener;
        (poVar4->_listener).next = &poVar4->_listener;
        protocol->_refcount = protocol->_refcount + 1;
        goto LAB_00103f19;
      }
    }
    else if (((&log_global_mask)[_oonf_rfc5444_subsystem.logging] & 4) != 0) {
      oonf_log(4,(ulong)_oonf_rfc5444_subsystem.logging,"src/base/oonf_rfc5444.c",0x237,0,0,
               "Could not get random data");
      return (oonf_rfc5444_interface *)0x0;
    }
    poVar4 = (oonf_rfc5444_interface *)0x0;
  }
  else {
    poVar4 = (oonf_rfc5444_interface *)(lVar3 + -0x18);
LAB_00103f19:
    if (((&log_global_mask)[_oonf_rfc5444_subsystem.logging] & 2) != 0) {
      oonf_log(2,(ulong)_oonf_rfc5444_subsystem.logging,"src/base/oonf_rfc5444.c",0x262,0,0,
               "Add interface %s to protocol %s (refcount was %d)",name,protocol,poVar4->_refcount);
    }
    poVar4->_refcount = poVar4->_refcount + 1;
    if (listener != (oonf_rfc5444_interface_listener *)0x0) {
      plVar1 = (poVar4->_listener).prev;
      (listener->_node).next = &poVar4->_listener;
      (listener->_node).prev = plVar1;
      (poVar4->_listener).prev = &listener->_node;
      plVar1->next = &listener->_node;
      listener->interface = poVar4;
    }
  }
  return poVar4;
}

Assistant:

struct oonf_rfc5444_interface *
oonf_rfc5444_add_interface(
  struct oonf_rfc5444_protocol *protocol, struct oonf_rfc5444_interface_listener *listener, const char *name) {
  struct oonf_rfc5444_interface *interf;
  uint16_t rnd;

  interf = oonf_rfc5444_get_interface(protocol, name);
  if (interf == NULL) {
    if (os_core_get_random(&rnd, sizeof(rnd))) {
      OONF_WARN(LOG_RFC5444, "Could not get random data");
      return NULL;
    }

    interf = oonf_class_malloc(&_interface_memcookie);
    if (interf == NULL) {
      return NULL;
    }

    /* set name */
    strscpy(interf->name, name, sizeof(interf->name));

    /* set protocol reference */
    interf->protocol = protocol;

    /* hook into protocol */
    interf->_node.key = interf->name;
    avl_insert(&protocol->_interface_tree, &interf->_node);

    /* initialize target subtree */
    avl_init(&interf->_target_tree, avl_comp_netaddr, false);

    /* initialize socket config */
    memcpy(&interf->_socket.config, &_socket_config, sizeof(_socket_config));
    interf->_socket.config.user = interf;
    interf->_socket.cb_settings_change = _cb_interface_changed;

    /* prevent routing of RFC5444 packets */
    interf->_socket.config.dont_route = true;

    /* initialize socket */
    oonf_packet_add_managed(&interf->_socket);

    /* initialize message sequence number */
    protocol->_msg_seqno = rnd;

    /* initialize listener list */
    list_init_head(&interf->_listener);

    /* increase protocol refcount */
    protocol->_refcount++;
  }

  OONF_INFO(LOG_RFC5444, "Add interface %s to protocol %s (refcount was %d)", name, protocol->name, interf->_refcount);

  /* increase reference count */
  interf->_refcount += 1;

  if (listener) {
    /* hookup listener */
    list_add_tail(&interf->_listener, &listener->_node);
    listener->interface = interf;
  }
  return interf;
}